

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

string * phosg::format_data_string
                   (string *__return_storage_ptr__,string *data,string *mask,uint64_t flags)

{
  logic_error *this;
  pointer size;
  uint64_t in_R9;
  
  if ((mask != (string *)0x0) && (mask->_M_string_length != data->_M_string_length)) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error(this,"data and mask sizes do not match");
    __cxa_throw(this,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
  }
  if (mask == (string *)0x0) {
    size = (pointer)0x0;
  }
  else {
    size = (mask->_M_dataplus)._M_p;
  }
  format_data_string_abi_cxx11_
            (__return_storage_ptr__,(phosg *)(data->_M_dataplus)._M_p,(void *)data->_M_string_length
             ,(size_t)size,(void *)flags,in_R9);
  return __return_storage_ptr__;
}

Assistant:

string format_data_string(const string& data, const string* mask, uint64_t flags) {
  if (mask && (mask->size() != data.size())) {
    throw logic_error("data and mask sizes do not match");
  }
  return format_data_string(data.data(), data.size(), mask ? mask->data() : nullptr, flags);
}